

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ElseClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ElseClauseSyntax,slang::parsing::Token,slang::syntax::SyntaxNode&>
          (BumpAllocator *this,Token *args,SyntaxNode *args_1)

{
  Token elseKeyword;
  ElseClauseSyntax *pEVar1;
  BumpAllocator *in_RDX;
  Info *in_RSI;
  size_t in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  pEVar1 = (ElseClauseSyntax *)allocate(in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  elseKeyword.info = in_RSI;
  elseKeyword._0_8_ = in_RDX;
  slang::syntax::ElseClauseSyntax::ElseClauseSyntax
            ((ElseClauseSyntax *)in_RSI->location,elseKeyword,(SyntaxNode *)in_RSI->rawTextPtr);
  return pEVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }